

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3MsrBufferData(Fts3MultiSegReader *pMsr,char *pList,int nList)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  u64 nBytes;
  
  if (pMsr->nBuffer < nList) {
    uVar1 = nList * 2;
    pMsr->nBuffer = uVar1;
    pcVar3 = pMsr->aBuffer;
    iVar2 = sqlite3_initialize();
    if (iVar2 != 0) {
      return 7;
    }
    nBytes = 0;
    if (0 < (int)uVar1) {
      nBytes = (u64)uVar1;
    }
    pcVar3 = (char *)sqlite3Realloc(pcVar3,nBytes);
    if (pcVar3 == (char *)0x0) {
      return 7;
    }
    pMsr->aBuffer = pcVar3;
  }
  else {
    pcVar3 = pMsr->aBuffer;
  }
  memcpy(pcVar3,pList,(long)nList);
  return 0;
}

Assistant:

static int fts3MsrBufferData(
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  char *pList,
  int nList
){
  if( nList>pMsr->nBuffer ){
    char *pNew;
    pMsr->nBuffer = nList*2;
    pNew = (char *)sqlite3_realloc(pMsr->aBuffer, pMsr->nBuffer);
    if( !pNew ) return SQLITE_NOMEM;
    pMsr->aBuffer = pNew;
  }

  memcpy(pMsr->aBuffer, pList, nList);
  return SQLITE_OK;
}